

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.h
# Opt level: O0

void __thiscall
oout::dirty::Test::
Test<std::shared_ptr<oout::NamedTest_const>,std::shared_ptr<oout::NamedTest_const>>
          (Test *this,string *name,shared_ptr<const_oout::NamedTest> *tests,
          shared_ptr<const_oout::NamedTest> *tests_1)

{
  undefined1 local_48 [16];
  shared_ptr<const_oout::Test> local_38;
  shared_ptr<const_oout::NamedTest> *local_28;
  shared_ptr<const_oout::NamedTest> *tests_local_1;
  shared_ptr<const_oout::NamedTest> *tests_local;
  string *name_local;
  Test *this_local;
  
  local_28 = tests_1;
  tests_local_1 = tests;
  tests_local = (shared_ptr<const_oout::NamedTest> *)name;
  name_local = (string *)this;
  std::
  make_shared<oout::NamedTest,std::__cxx11::string_const&,std::shared_ptr<oout::NamedTest_const>const&,std::shared_ptr<oout::NamedTest_const>const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
             (shared_ptr<const_oout::NamedTest> *)name,tests);
  std::shared_ptr<oout::Test_const>::shared_ptr<oout::NamedTest,void>
            ((shared_ptr<oout::Test_const> *)&local_38,(shared_ptr<oout::NamedTest> *)local_48);
  Test(this,&local_38);
  std::shared_ptr<const_oout::Test>::~shared_ptr(&local_38);
  std::shared_ptr<oout::NamedTest>::~shared_ptr((shared_ptr<oout::NamedTest> *)local_48);
  return;
}

Assistant:

Test(
		const std::string &name,
		const T & ... tests
	) : Test(std::make_shared<oout::NamedTest>(name, tests...))
	{
	}